

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O1

void soplex::MPSreadObjsen(MPSInput *mps)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  Sense SVar4;
  
  bVar2 = MPSInput::readLine(mps);
  if ((bVar2) && (pcVar1 = mps->m_f1, pcVar1 != (char *)0x0)) {
    iVar3 = strcmp(pcVar1,"MIN");
    if (iVar3 == 0) {
      SVar4 = MINIMIZE;
    }
    else {
      iVar3 = strcmp(pcVar1,"MAX");
      if (iVar3 != 0) goto LAB_0012caf0;
      SVar4 = MAXIMIZE;
    }
    mps->m_objsense = SVar4;
    bVar2 = MPSInput::readLine(mps);
    if ((bVar2) && (pcVar1 = mps->m_f0, pcVar1 != (char *)0x0)) {
      iVar3 = strcmp(pcVar1,"ROWS");
      if (iVar3 == 0) {
        mps->m_section = ROWS;
      }
      else {
        iVar3 = strcmp(pcVar1,"OBJNAME");
        if (iVar3 != 0) goto LAB_0012caf0;
        mps->m_section = OBJNAME;
      }
      return;
    }
  }
LAB_0012caf0:
  MPSInput::syntaxError(mps);
  return;
}

Assistant:

static inline void MPSreadObjsen(MPSInput& mps)
{
   do
   {
      // This has to be the Line with MIN or MAX.
      if(!mps.readLine() || (mps.field1() == nullptr))
         break;

      if(!strcmp(mps.field1(), "MIN"))
         mps.setObjSense(MPSInput::MINIMIZE);
      else if(!strcmp(mps.field1(), "MAX"))
         mps.setObjSense(MPSInput::MAXIMIZE);
      else
         break;

      // Look for ROWS or OBJNAME Section
      if(!mps.readLine() || (mps.field0() == nullptr))
         break;

      if(!strcmp(mps.field0(), "ROWS"))
         mps.setSection(MPSInput::ROWS);
      else if(!strcmp(mps.field0(), "OBJNAME"))
         mps.setSection(MPSInput::OBJNAME);
      else
         break;

      return;
   }
   while(false);

   mps.syntaxError();
}